

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

void __thiscall smf::MidiFile::clearLinks(MidiFile *this)

{
  pointer ppMVar1;
  MidiEventList *this_00;
  int i;
  long lVar2;
  
  for (lVar2 = 0;
      ppMVar1 = (this->m_events).
                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      lVar2 < (int)((ulong)((long)(this->m_events).
                                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1) >> 3);
      lVar2 = lVar2 + 1) {
    this_00 = ppMVar1[lVar2];
    if (this_00 != (MidiEventList *)0x0) {
      MidiEventList::clearLinks(this_00);
    }
  }
  this->m_linkedEventsQ = false;
  return;
}

Assistant:

void MidiFile::clearLinks(void) {
	for (int i=0; i<getTrackCount(); i++) {
		if (m_events[i] == NULL) {
			continue;
		}
		m_events[i]->clearLinks();
	}
	m_linkedEventsQ = false;
}